

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O1

FunctionBody * __thiscall
Js::ProbeContainer::GetGlobalFunc
          (ProbeContainer *this,ScriptContext *scriptContext,DWORD_PTR secondaryHostSourceContext)

{
  RecyclerWeakReference<Js::Utf8SourceInfo> *pRVar1;
  Type pcVar2;
  long *plVar3;
  FunctionBody *this_00;
  code *pcVar4;
  bool bVar5;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *pLVar6;
  undefined4 *puVar7;
  DWORD_PTR DVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  FunctionBody *pFVar12;
  int iVar13;
  
  pLVar6 = Memory::
           RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
           ::operator->(&scriptContext->sourceList);
  if ((pLVar6->
      super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
      ).count < 1) {
    pFVar12 = (FunctionBody *)0x0;
  }
  else {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    pFVar12 = (FunctionBody *)0x0;
    lVar11 = 0;
    do {
      pRVar1 = (pLVar6->
               super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
               ).buffer.ptr[lVar11].ptr;
      if ((((ulong)pRVar1 & 1) == 0 && pRVar1 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0)
         && (pcVar2 = (pRVar1->super_RecyclerWeakReferenceBase).strongRef, pcVar2 != (Type)0x0)) {
        plVar3 = *(long **)(pcVar2 + 0x18);
        if ((plVar3 == (long *)0x0) || (*(int *)((long)plVar3 + 0x1c) == 0)) {
          pFVar12 = (FunctionBody *)0x0;
        }
        else {
          pFVar12 = (FunctionBody *)0x0;
          uVar10 = 0;
          do {
            iVar13 = *(int *)(*plVar3 + uVar10 * 4);
            while (iVar13 != -1) {
              lVar9 = (long)iVar13;
              iVar13 = *(int *)(plVar3[1] + 8 + lVar9 * 0x10);
              this_00 = *(FunctionBody **)(plVar3[1] + lVar9 * 0x10);
              if (this_00 == (FunctionBody *)0x0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *puVar7 = 1;
                bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                            ,199,"(functionBody)","functionBody");
                if (!bVar5) {
                  pcVar4 = (code *)invalidInstructionException();
                  (*pcVar4)();
                }
                *puVar7 = 0;
              }
              DVar8 = FunctionProxy::GetSecondaryHostSourceContext((FunctionProxy *)this_00);
              if ((DVar8 == secondaryHostSourceContext) &&
                 (((this_00->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 0x10) !=
                  0)) {
                pFVar12 = this_00;
              }
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 < *(uint *)((long)plVar3 + 0x1c));
        }
        if (pFVar12 != (FunctionBody *)0x0) {
          return pFVar12;
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (pLVar6->
                      super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                      ).count);
  }
  return pFVar12;
}

Assistant:

FunctionBody * ProbeContainer::GetGlobalFunc(ScriptContext* scriptContext, DWORD_PTR secondaryHostSourceContext)
    {
        return scriptContext->FindFunction([&secondaryHostSourceContext] (FunctionBody* pFunc) {
            return ((pFunc->GetSecondaryHostSourceContext() == secondaryHostSourceContext) &&
                     pFunc->GetIsGlobalFunc());
        });
    }